

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

BOOL js_is_live_code(JSParseState *s)

{
  byte bVar1;
  long lVar2;
  
  lVar2 = (long)s->cur_func->last_opcode_pos;
  if (-1 < lVar2) {
    bVar1 = (s->cur_func->byte_code).buf[lVar2];
    if (((((ulong)bVar1 < 0x31) && ((0x1c32800000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
        (bVar1 - 0xea < 2)) || ((bVar1 == 0x6b || (bVar1 == 0x6e)))) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static BOOL js_is_live_code(JSParseState *s) {
    switch (get_prev_opcode(s->cur_func)) {
    case OP_tail_call:
    case OP_tail_call_method:
    case OP_return:
    case OP_return_undef:
    case OP_return_async:
    case OP_throw:
    case OP_throw_error:
    case OP_goto:
#if SHORT_OPCODES
    case OP_goto8:
    case OP_goto16:
#endif
    case OP_ret:
        return FALSE;
    default:
        return TRUE;
    }
}